

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

VariablePtr createVariableWithUnits(string *name,string *units)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VariablePtr VVar1;
  
  libcellml::Variable::create();
  libcellml::NamedEntity::setName((string *)(name->_M_dataplus)._M_p);
  libcellml::Variable::setUnits((string *)(name->_M_dataplus)._M_p);
  VVar1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)name;
  return (VariablePtr)VVar1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::VariablePtr createVariableWithUnits(const std::string &name, const std::string &units)
{
    libcellml::VariablePtr v = libcellml::Variable::create();
    v->setName(name);
    v->setUnits(units);

    return v;
}